

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagAlias::~TagAlias(TagAlias *this)

{
  TagAlias *this_local;
  
  SourceLineInfo::~SourceLineInfo(&this->lineInfo);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}